

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Savepoint.cpp
# Opt level: O2

void __thiscall ser::Savepoint::FromJSON(Savepoint *this,JSONNode *node)

{
  char cVar1;
  JSONNode *this_00;
  JSONNode **ppJVar2;
  JSONNode **ppJVar3;
  allocator local_1f0 [32];
  SerializationException exception;
  ostringstream ss;
  
  std::__cxx11::string::string((string *)&exception,"__name",local_1f0);
  this_00 = ::JSONNode::at(node,(json_string *)&exception);
  ::JSONNode::as_string_abi_cxx11_((json_string *)&ss,this_00);
  std::__cxx11::string::operator=((string *)this,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::~string((string *)&exception);
  MetainfoSet::Cleanup(&this->metainfo_);
  ppJVar2 = internalJSONNode::begin(node->internal);
  do {
    ppJVar3 = internalJSONNode::end(node->internal);
    if (ppJVar2 == ppJVar3) {
      return;
    }
    ::JSONNode::name_abi_cxx11_((json_string *)&ss,*ppJVar2);
    if (*_ss == '_') {
      ::JSONNode::name_abi_cxx11_((json_string *)&exception,*ppJVar2);
      cVar1 = *(char *)(exception._0_8_ + 1);
      std::__cxx11::string::~string((string *)&exception);
      std::__cxx11::string::~string((string *)&ss);
      if (cVar1 != '_') goto LAB_00168c2f;
    }
    else {
      std::__cxx11::string::~string((string *)&ss);
LAB_00168c2f:
      MetainfoSet::AddNode(&this->metainfo_,*ppJVar2);
    }
    ppJVar2 = ppJVar2 + 1;
  } while( true );
}

Assistant:

void Savepoint::FromJSON(const JSONNode& node)
{
    // Name
    try
    {
        name_ = node.at("__name").as_string();
    }
    catch(std::out_of_range&)
    {
        SerializationException exception;
        std::ostringstream ss;
        ss << "Error: Savepoint node does not have a name:\n"
           << node.write_formatted() << "\n";
        exception.Init(ss.str());
        throw exception;
    }

    // Metainfo
    // Nodes whose name starts with __ are skipped
    metainfo_.Cleanup();
    for (JSONNode::const_iterator iter = node.begin(); iter != node.end(); ++iter)
        if (!(iter->name()[0] == '_' && iter->name()[1] == '_'))
            metainfo_.AddNode(*iter);
}